

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CGUIFont.cpp
# Opt level: O0

s32 __thiscall irr::gui::CGUIFont::getCharacterFromPos(CGUIFont *this,wchar_t *text,s32 pixel_x)

{
  array<irr::gui::CGUIFont::SFontArea> *this_00;
  int in_EDX;
  long in_RSI;
  long in_RDI;
  SFontArea *a;
  s32 idx;
  s32 x;
  u32 in_stack_ffffffffffffffbc;
  SFontArea *in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd8;
  int iVar1;
  int local_20;
  
  local_20 = 0;
  iVar1 = 0;
  while( true ) {
    if (*(int *)(in_RSI + (long)iVar1 * 4) == 0) {
      return -1;
    }
    this_00 = (array<irr::gui::CGUIFont::SFontArea> *)(in_RDI + 8);
    getAreaFromCharacter
              ((CGUIFont *)CONCAT44(iVar1,in_stack_ffffffffffffffd8),
               (wchar_t)((ulong)in_stack_ffffffffffffffd0 >> 0x20));
    in_stack_ffffffffffffffd0 =
         core::array<irr::gui::CGUIFont::SFontArea>::operator[](this_00,in_stack_ffffffffffffffbc);
    local_20 = in_stack_ffffffffffffffd0->width + in_stack_ffffffffffffffd0->overhang +
               in_stack_ffffffffffffffd0->underhang + *(int *)(in_RDI + 0x78) + local_20;
    if (in_EDX <= local_20) break;
    iVar1 = iVar1 + 1;
  }
  return iVar1;
}

Assistant:

s32 CGUIFont::getCharacterFromPos(const wchar_t *text, s32 pixel_x) const
{
	s32 x = 0;
	s32 idx = 0;

	while (text[idx]) {
		const SFontArea &a = Areas[getAreaFromCharacter(text[idx])];

		x += a.width + a.overhang + a.underhang + GlobalKerningWidth;

		if (x >= pixel_x)
			return idx;

		++idx;
	}

	return -1;
}